

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

bool QFontDatabase::hasFamily(QString *family)

{
  QtFontFamily *pQVar1;
  int *piVar2;
  int iVar3;
  undefined4 extraout_var;
  Type *pTVar4;
  bool bVar5;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *this;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QDeadlineTimer QVar8;
  QString local_88;
  QString local_68;
  QString local_48;
  long local_30;
  
  this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *)
         &local_88;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  parseFontName(family,&local_68,&local_48);
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d._0_4_ = 0xaaaaaaaa;
  local_88.d.d._4_4_ = 0xaaaaaaaa;
  local_88.d.ptr._0_4_ = 0xaaaaaaaa;
  local_88.d.ptr._4_4_ = 0xaaaaaaaa;
  iVar3 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x78))
            (&local_88,(long *)CONCAT44(extraout_var,iVar3),&local_48);
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()(this);
  if (pTVar4 != (Type *)0x0) {
    QVar8.t2 = 0xffffffff;
    QVar8.type = 0x7fffffff;
    QVar8.t1 = (qint64)pTVar4;
    QRecursiveMutex::tryLock(QVar8);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  bVar5 = 0 < QFontDatabasePrivate::instance::instance.count;
  if (0 < QFontDatabasePrivate::instance::instance.count) {
    lVar6 = 0;
    do {
      pQVar1 = QFontDatabasePrivate::instance::instance.families[lVar6];
      if (((undefined1  [112])((undefined1  [112])*pQVar1 & (undefined1  [112])0x1) ==
           (undefined1  [112])0x0) || (bVar7 = false, pQVar1->count != 0)) {
        iVar3 = QString::compare(&local_88,(int)pQVar1 + 8);
        bVar7 = iVar3 == 0;
      }
      if (bVar7) break;
      lVar6 = lVar6 + 1;
      bVar5 = lVar6 < QFontDatabasePrivate::instance::instance.count;
    } while (lVar6 < QFontDatabasePrivate::instance::instance.count);
  }
  if (pTVar4 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  piVar2 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::hasFamily(const QString &family)
{
    QString parsedFamily, foundry;
    parseFontName(family, foundry, parsedFamily);
    const QString familyAlias = QFontDatabasePrivate::resolveFontFamilyAlias(parsedFamily);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    for (int i = 0; i < d->count; i++) {
        QtFontFamily *f = d->families[i];
        if (f->populated && f->count == 0)
            continue;
        if (familyAlias.compare(f->name, Qt::CaseInsensitive) == 0)
            return true;
    }

    return false;
}